

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519-donna-64bit.h
# Opt level: O0

void curve25519_mul_noinline(uint64_t *out,uint64_t *in2,uint64_t *in)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  uint64_t *in_local;
  uint64_t *in2_local;
  uint64_t *out_local;
  uint64_t c;
  uint64_t s4;
  uint64_t s3;
  uint64_t s2;
  uint64_t s1;
  uint64_t s0;
  uint64_t r4;
  uint64_t r3;
  uint64_t r2;
  uint64_t r1;
  uint64_t r0;
  uint128_t t [5];
  
  uVar59 = *in;
  uVar60 = in[1];
  uVar61 = in[2];
  uVar62 = in[3];
  uVar63 = *in2;
  uVar1 = in2[1];
  uVar2 = in2[2];
  uVar3 = in2[3];
  uVar4 = in2[4];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar59;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar63;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar59;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar1;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar60;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar63;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar59;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar2;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar61;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar63;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar60;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar1;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar59;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar3;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar62;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar63;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar60;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar2;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar61;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar1;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar59;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar4;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = in[4];
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar63;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar62;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar1;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar60;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar3;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar61;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar2;
  uVar62 = uVar62 * 0x13;
  uVar59 = in[4] * 0x13;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar59;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar1;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar60 * 0x13;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar4;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar61 * 0x13;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uVar3;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar62;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar2;
  auVar5 = auVar23 * auVar48 + auVar22 * auVar47 + auVar21 * auVar46 + auVar20 * auVar45 +
           auVar5 * auVar30;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar59;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar2;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar61 * 0x13;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar4;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar62;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar3;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar59;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar3;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar62;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar4;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar59;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar4;
  r0 = auVar5._0_8_;
  t[0]._0_8_ = auVar5._8_8_;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = (long)t[0] << 0xd | r0 >> 0x33;
  auVar55 = auVar26 * auVar51 + auVar25 * auVar50 + auVar24 * auVar49 +
            auVar7 * auVar32 + auVar6 * auVar31 + auVar55;
  uVar60 = auVar55._0_8_;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = auVar55._8_8_ << 0xd | uVar60 >> 0x33;
  auVar56 = auVar28 * auVar53 + auVar27 * auVar52 +
            auVar10 * auVar35 + auVar9 * auVar34 + auVar8 * auVar33 + auVar56;
  uVar61 = auVar56._0_8_;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = auVar56._8_8_ << 0xd | uVar61 >> 0x33;
  auVar57 = auVar29 * auVar54 +
            auVar14 * auVar39 + auVar13 * auVar38 + auVar12 * auVar37 + auVar11 * auVar36 + auVar57;
  uVar62 = auVar57._0_8_;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = auVar57._8_8_ << 0xd | uVar62 >> 0x33;
  auVar58 = auVar19 * auVar44 +
            auVar18 * auVar43 + auVar17 * auVar42 + auVar16 * auVar41 + auVar15 * auVar40 + auVar58;
  uVar63 = auVar58._0_8_;
  uVar59 = (auVar58._8_8_ << 0xd | uVar63 >> 0x33) * 0x13 + (r0 & 0x7ffffffffffff);
  *out = uVar59 & 0x7ffffffffffff;
  out[1] = (uVar59 >> 0x33) + (uVar60 & 0x7ffffffffffff);
  out[2] = uVar61 & 0x7ffffffffffff;
  out[3] = uVar62 & 0x7ffffffffffff;
  out[4] = uVar63 & 0x7ffffffffffff;
  return;
}

Assistant:

DONNA_NOINLINE static void
curve25519_mul_noinline(bignum25519 out, const bignum25519 in2, const bignum25519 in) {
	curve25519_mul(out, in2, in);
}